

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void embree::SceneGraph::convert_mblur_to_nonmblur(Ref<embree::SceneGraph::Node> *node)

{
  Node *pNVar1;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar2;
  __int_type_conflict _Var3;
  size_type sVar4;
  undefined8 uVar5;
  undefined7 uVar6;
  ulong uVar7;
  Node *pNVar8;
  size_t sVar9;
  Ref<embree::SceneGraph::Node> *pRVar10;
  Node *pNVar11;
  reference pvVar12;
  avector<AffineSpace3ff> *paVar13;
  unsigned_long *puVar14;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar15;
  reference pvVar16;
  size_type sVar17;
  long *in_RDI;
  Ref<embree::SceneGraph::GridMeshNode> mesh_5;
  Ref<embree::SceneGraph::SubdivMeshNode> mesh_4;
  Ref<embree::SceneGraph::PointSetNode> mesh_3;
  Ref<embree::SceneGraph::HairSetNode> mesh_2;
  Ref<embree::SceneGraph::QuadMeshNode> mesh_1;
  Ref<embree::SceneGraph::TriangleMeshNode> mesh;
  size_t i_9;
  Ref<embree::SceneGraph::GroupNode> groupNode;
  size_t i_4;
  Ref<embree::SceneGraph::MultiTransformNode> xfmNode_1;
  Ref<embree::SceneGraph::TransformNode> xfmNode;
  size_t i_3;
  size_t i_2;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *old_items;
  size_t i_1;
  size_t i;
  size_t i_8;
  size_t i_7;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *old_items_1;
  size_t i_6;
  size_t i_5;
  size_t new_size_alloced;
  size_t new_size_alloced_1;
  void *in_stack_fffffffffffff578;
  size_t in_stack_fffffffffffff580;
  size_t in_stack_fffffffffffff588;
  size_type in_stack_fffffffffffff598;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_fffffffffffff5a0;
  long *local_9d8;
  long *local_998;
  long *local_958;
  long *local_8f8;
  long *local_8b8;
  long *local_878;
  long *local_828;
  long *local_798;
  Ref<embree::SceneGraph::Node> *local_718;
  long *local_6f0;
  long *local_6e8;
  long *local_6e0;
  long *local_6d8;
  Node *local_6d0;
  ulong local_6c8;
  long *local_6c0;
  long *local_6b8;
  ulong local_6b0;
  long *local_6a8;
  Node *local_6a0;
  Ref<embree::SceneGraph::Node> *pRVar18;
  Node *local_350;
  Node *local_348;
  Node *local_338;
  Node *local_330;
  size_t local_2f0;
  ulong local_2e8;
  size_t local_2d8;
  ulong local_2d0;
  unsigned_long local_290 [2];
  Node *local_280;
  Node *local_278;
  Ref<embree::SceneGraph::Node> *local_270;
  Node *local_268;
  unsigned_long local_260 [2];
  ulong local_250;
  ulong local_248;
  avector<AffineSpace3ff> *local_240;
  size_t local_238;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_230;
  RefCount *local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_220;
  string *local_218;
  RefCount *local_210;
  Vector *local_208;
  Vector *local_200;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_1f8;
  Vector *local_1f0;
  string *local_1e8;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_1e0;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_1d8;
  Vector *local_1d0;
  Vector *local_1c8;
  Vector *local_1c0;
  Vector *local_1b8;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_1b0;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_1a8;
  RefCount *local_1a0;
  RefCount *local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_188;
  string *local_180;
  string *local_178;
  RefCount *local_170;
  RefCount *local_168;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_160;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_158;
  Vector *local_150;
  Vector *local_148;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_140;
  Vector *local_138;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_130;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_128;
  Vector *local_120;
  Vector *local_118;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_110;
  Vector *local_108;
  Node *local_100;
  Node *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_f0;
  string *local_e8;
  Node *local_e0;
  string *local_d8;
  Node *local_d0;
  Node *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_c0;
  string *local_b8;
  Node *local_b0;
  string *local_a8;
  size_t local_a0;
  avector<AffineSpace3ff> *local_98;
  Node *local_90;
  Ref<embree::SceneGraph::Node> *local_88;
  size_t local_80;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_78;
  avector<AffineSpace3ff> *local_70;
  Node *local_68;
  Node *local_60;
  Ref<embree::SceneGraph::Node> *local_58;
  Ref<embree::SceneGraph::Node> *local_50;
  undefined1 *local_48;
  long *local_40;
  long **local_38;
  long *local_30;
  long **local_28;
  long *local_20;
  long **local_18;
  long *local_10;
  long **local_8;
  
  if (*in_RDI == 0) {
    local_718 = (Ref<embree::SceneGraph::Node> *)0x0;
  }
  else {
    local_718 = (Ref<embree::SceneGraph::Node> *)
                __dynamic_cast(*in_RDI,&Node::typeinfo,&TransformNode::typeinfo,0);
  }
  local_48 = &stack0xfffffffffffff978;
  local_50 = local_718;
  if (local_718 != (Ref<embree::SceneGraph::Node> *)0x0) {
    (**(code **)&local_718->ptr->fileName)();
  }
  pRVar18 = local_718;
  if (local_718 == (Ref<embree::SceneGraph::Node> *)0x0) {
    if (*in_RDI == 0) {
      local_798 = (long *)0x0;
    }
    else {
      local_798 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
      pRVar18 = local_718;
    }
    local_8 = &local_6a8;
    local_10 = local_798;
    local_6a8 = local_798;
    if (local_798 != (long *)0x0) {
      (**(code **)(*local_798 + 0x10))();
    }
    if (local_6a8 == (long *)0x0) {
      if (*in_RDI == 0) {
        local_828 = (long *)0x0;
      }
      else {
        local_828 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&GroupNode::typeinfo,0);
      }
      local_38 = &local_6c0;
      local_40 = local_828;
      local_6c0 = local_828;
      if (local_828 != (long *)0x0) {
        (**(code **)(*local_828 + 0x10))();
      }
      if (local_6c0 == (long *)0x0) {
        if (*in_RDI == 0) {
          local_878 = (long *)0x0;
        }
        else {
          local_878 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
        }
        local_28 = &local_6d8;
        local_30 = local_878;
        local_6d8 = local_878;
        if (local_878 != (long *)0x0) {
          (**(code **)(*local_878 + 0x10))();
        }
        if (local_6d8 == (long *)0x0) {
          if (*in_RDI == 0) {
            local_8b8 = (long *)0x0;
          }
          else {
            local_8b8 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
          }
          local_6e0 = local_8b8;
          if (local_8b8 != (long *)0x0) {
            (**(code **)(*local_8b8 + 0x10))();
          }
          if (local_6e0 == (long *)0x0) {
            if (*in_RDI == 0) {
              local_8f8 = (long *)0x0;
            }
            else {
              local_8f8 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&HairSetNode::typeinfo,0);
            }
            local_6e8 = local_8f8;
            if (local_8f8 != (long *)0x0) {
              (**(code **)(*local_8f8 + 0x10))();
            }
            if (local_6e8 == (long *)0x0) {
              if (*in_RDI == 0) {
                local_958 = (long *)0x0;
              }
              else {
                local_958 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&PointSetNode::typeinfo,0
                                                  );
              }
              local_18 = &local_6f0;
              local_20 = local_958;
              local_6f0 = local_958;
              if (local_958 != (long *)0x0) {
                (**(code **)(*local_958 + 0x10))();
              }
              if (local_6f0 == (long *)0x0) {
                if (*in_RDI == 0) {
                  local_998 = (long *)0x0;
                }
                else {
                  local_998 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,
                                                     &SubdivMeshNode::typeinfo,0);
                }
                if (local_998 == (long *)0x0) {
                  if (*in_RDI == 0) {
                    local_9d8 = (long *)0x0;
                  }
                  else {
                    local_9d8 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,
                                                       &GridMeshNode::typeinfo,0);
                  }
                  if (local_9d8 != (long *)0x0) {
                    (**(code **)(*local_9d8 + 0x10))();
                    std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::resize(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
                    (**(code **)(*local_9d8 + 0x18))();
                  }
                }
                else {
                  (**(code **)(*local_998 + 0x10))();
                  sVar17 = std::
                           vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                           ::size((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                   *)(local_998 + 0xe));
                  if (sVar17 != 0) {
                    std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::resize(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
                  }
                  sVar17 = std::
                           vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                           ::size((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                   *)(local_998 + 0x11));
                  if (sVar17 != 0) {
                    std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::resize(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
                  }
                }
                if (local_998 != (long *)0x0) {
                  (**(code **)(*local_998 + 0x18))();
                }
              }
              else {
                sVar17 = std::
                         vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                         ::size((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                 *)(local_6f0 + 0xf));
                if (sVar17 != 0) {
                  std::
                  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ::resize((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                            *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
                }
                sVar17 = std::
                         vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ::size((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                 *)(local_6f0 + 0x12));
                if (sVar17 != 0) {
                  std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::resize(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
                }
              }
              if (local_6f0 != (long *)0x0) {
                (**(code **)(*local_6f0 + 0x18))();
              }
            }
            else {
              sVar17 = std::
                       vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                       ::size((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                               *)(local_6e8 + 0xf));
              if (sVar17 != 0) {
                std::
                vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ::resize((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                          *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
              }
              sVar17 = std::
                       vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                       ::size((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                               *)(local_6e8 + 0x12));
              if (sVar17 != 0) {
                std::
                vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ::resize(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
              }
              sVar17 = std::
                       vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                       ::size((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                               *)(local_6e8 + 0x15));
              if (sVar17 != 0) {
                std::
                vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ::resize((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                          *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
              }
              sVar17 = std::
                       vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                       ::size((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                               *)(local_6e8 + 0x18));
              if (sVar17 != 0) {
                std::
                vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ::resize(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
              }
            }
            if (local_6e8 != (long *)0x0) {
              (**(code **)(*local_6e8 + 0x18))();
            }
          }
          else {
            sVar17 = std::
                     vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                     ::size((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                             *)(local_6e0 + 0xe));
            if (sVar17 != 0) {
              std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::resize(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
            }
            sVar17 = std::
                     vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                     ::size((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                             *)(local_6e0 + 0x11));
            if (sVar17 != 0) {
              std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::resize(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
            }
          }
          if (local_6e0 != (long *)0x0) {
            (**(code **)(*local_6e0 + 0x18))();
          }
        }
        else {
          sVar17 = std::
                   vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   ::size((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                           *)(local_6d8 + 0xe));
          if (sVar17 != 0) {
            std::
            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ::resize(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
          }
          sVar17 = std::
                   vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   ::size((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                           *)(local_6d8 + 0x11));
          if (sVar17 != 0) {
            std::
            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ::resize(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
          }
        }
        if (local_6d8 != (long *)0x0) {
          (**(code **)(*local_6d8 + 0x18))();
        }
      }
      else {
        for (local_6c8 = 0; uVar7 = local_6c8,
            sVar17 = std::
                     vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                     ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                             *)(local_6c0 + 0xd)), uVar7 < sVar17; local_6c8 = local_6c8 + 1) {
          pvVar16 = std::
                    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                    ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                  *)(local_6c0 + 0xd),local_6c8);
          local_6d0 = pvVar16->ptr;
          if (local_6d0 != (Node *)0x0) {
            (*(local_6d0->super_RefCount)._vptr_RefCount[2])();
          }
          convert_mblur_to_nonmblur(pRVar18);
          if (local_6d0 != (Node *)0x0) {
            (*(local_6d0->super_RefCount)._vptr_RefCount[3])();
          }
        }
      }
      if (local_6c0 != (long *)0x0) {
        (**(code **)(*local_6c0 + 0x18))();
      }
    }
    else {
      for (local_6b0 = 0; uVar7 = local_6b0,
          sVar17 = std::
                   vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                   ::size((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                           *)(local_6a8 + 0xd)), uVar7 < sVar17; local_6b0 = local_6b0 + 1) {
        pvVar12 = std::
                  vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                  ::operator[]((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                                *)(local_6a8 + 0xd),local_6b0);
        paVar13 = &pvVar12->spaces;
        local_248 = 1;
        local_240 = paVar13;
        if ((pvVar12->spaces).size_alloced == 0) {
          if ((pvVar12->spaces).size_alloced == 0) {
            local_238 = 1;
          }
          else {
            local_250 = (pvVar12->spaces).size_alloced;
            while (local_250 < local_248) {
              local_260[1] = 1;
              local_260[0] = local_250 << 1;
              puVar14 = std::max<unsigned_long>(local_260 + 1,local_260);
              local_250 = *puVar14;
            }
            local_238 = local_250;
          }
        }
        else {
          local_238 = (pvVar12->spaces).size_alloced;
        }
        sVar9 = local_238;
        if (1 < (pvVar12->spaces).size_active) {
          for (local_2d0 = 1; local_2d0 < (pvVar12->spaces).size_active; local_2d0 = local_2d0 + 1)
          {
          }
          (pvVar12->spaces).size_active = 1;
        }
        if (local_238 == (pvVar12->spaces).size_alloced) {
          local_2d8 = (pvVar12->spaces).size_active;
          while (local_2d8 == 0) {
            local_130 = (pvVar12->spaces).items;
            local_118 = &(local_130->l).vy;
            local_120 = &(local_130->l).vz;
            local_108 = &local_130->p;
            local_128 = local_130;
            local_110 = local_130;
            local_2d8 = 1;
          }
          (pvVar12->spaces).size_active = 1;
        }
        else {
          pAVar2 = (pvVar12->spaces).items;
          local_a0 = local_238;
          local_98 = paVar13;
          pAVar15 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                    alignedMalloc(in_stack_fffffffffffff588,in_stack_fffffffffffff580);
          (pvVar12->spaces).items = pAVar15;
          for (local_2e8 = 0; local_2e8 < (pvVar12->spaces).size_active; local_2e8 = local_2e8 + 1)
          {
            local_230 = (pvVar12->spaces).items + local_2e8;
            local_1e0 = pAVar2 + local_2e8;
            local_200 = &(local_230->l).vy;
            local_208 = &(local_230->l).vz;
            local_1f0 = &local_230->p;
            uVar5 = *(undefined8 *)((long)&(local_1e0->l).vx.field_0 + 8);
            *(undefined8 *)&(local_230->l).vx.field_0 = *(undefined8 *)&(local_1e0->l).vx.field_0;
            *(undefined8 *)((long)&(local_230->l).vx.field_0 + 8) = uVar5;
            local_1c0 = &(local_1e0->l).vy;
            local_1b8 = &(local_230->l).vy;
            uVar5 = *(undefined8 *)((long)&(local_1e0->l).vy.field_0 + 8);
            *(undefined8 *)&local_1b8->field_0 = *(undefined8 *)&local_1c0->field_0;
            *(undefined8 *)((long)&(local_230->l).vy.field_0 + 8) = uVar5;
            local_1d0 = &(local_1e0->l).vz;
            local_1c8 = &(local_230->l).vz;
            uVar5 = *(undefined8 *)((long)&(local_1e0->l).vz.field_0 + 8);
            *(undefined8 *)&local_1c8->field_0 = *(undefined8 *)&local_1d0->field_0;
            *(undefined8 *)((long)&(local_230->l).vz.field_0 + 8) = uVar5;
            uVar5 = *(undefined8 *)((long)&(local_1e0->p).field_0 + 8);
            *(undefined8 *)&(local_230->p).field_0 = *(undefined8 *)&(local_1e0->p).field_0;
            *(undefined8 *)((long)&(local_230->p).field_0 + 8) = uVar5;
            local_1f8 = local_230;
            local_1d8 = local_230;
            local_1b0 = local_1e0;
            local_1a8 = local_230;
          }
          local_2f0 = (pvVar12->spaces).size_active;
          while (local_2f0 == 0) {
            local_160 = (pvVar12->spaces).items;
            local_148 = &(local_160->l).vy;
            local_150 = &(local_160->l).vz;
            local_138 = &local_160->p;
            local_158 = local_160;
            local_140 = local_160;
            local_2f0 = 1;
          }
          local_80 = (pvVar12->spaces).size_alloced;
          local_78 = pAVar2;
          local_70 = paVar13;
          alignedFree(in_stack_fffffffffffff578);
          (pvVar12->spaces).size_active = 1;
          (pvVar12->spaces).size_alloced = sVar9;
        }
      }
      local_6b8 = (long *)local_6a8[0x10];
      if (local_6b8 != (long *)0x0) {
        (**(code **)(*local_6b8 + 0x10))();
      }
      convert_mblur_to_nonmblur(pRVar18);
      if (local_6b8 != (long *)0x0) {
        (**(code **)(*local_6b8 + 0x18))();
      }
    }
    if (local_6a8 != (long *)0x0) {
      (**(code **)(*local_6a8 + 0x18))();
    }
  }
  else {
    pRVar10 = local_718 + 0xe;
    local_278 = (Node *)0x1;
    local_270 = pRVar10;
    if (local_718[0x10].ptr == (Node *)0x0) {
      if (local_718[0x10].ptr == (Node *)0x0) {
        local_268 = (Node *)0x1;
      }
      else {
        local_280 = local_718[0x10].ptr;
        while (local_280 < local_278) {
          local_290[1] = 1;
          local_290[0] = (long)local_280 << 1;
          puVar14 = std::max<unsigned_long>(local_290 + 1,local_290);
          local_280 = (Node *)*puVar14;
        }
        local_268 = local_280;
      }
    }
    else {
      local_268 = local_718[0x10].ptr;
    }
    pNVar8 = local_268;
    if ((Node *)0x1 < local_718[0xf].ptr) {
      for (local_330 = (Node *)0x1; local_330 < local_718[0xf].ptr;
          local_330 = (Node *)((long)&(local_330->super_RefCount)._vptr_RefCount + 1)) {
      }
      local_718[0xf].ptr = (Node *)0x1;
    }
    if (local_268 == local_718[0x10].ptr) {
      local_338 = local_718[0xf].ptr;
      while (local_338 == (Node *)0x0) {
        local_d0 = local_718[0x11].ptr;
        local_b8 = &local_d0->fileName;
        local_c0 = &(local_d0->fileName).field_2;
        local_a8 = &local_d0->name;
        local_c8 = local_d0;
        local_b0 = local_d0;
        local_338 = (Node *)0x1;
      }
      local_718[0xf].ptr = (Node *)0x1;
    }
    else {
      pNVar1 = local_718[0x11].ptr;
      local_90 = local_268;
      local_88 = pRVar10;
      pNVar11 = (Node *)alignedMalloc(in_stack_fffffffffffff588,in_stack_fffffffffffff580);
      local_718[0x11].ptr = pNVar11;
      for (local_348 = (Node *)0x0; local_348 < local_718[0xf].ptr;
          local_348 = (Node *)((long)&(local_348->super_RefCount)._vptr_RefCount + 1)) {
        local_228 = &(local_718[0x11].ptr)->super_RefCount + (long)local_348 * 4;
        local_1a0 = &pNVar1->super_RefCount + (long)local_348 * 4;
        local_218 = (string *)(local_228 + 1);
        local_220 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                     *)(local_228 + 2);
        local_1e8 = (string *)(local_228 + 3);
        _Var3 = (local_1a0->refCounter).super___atomic_base<unsigned_long>._M_i;
        local_228->_vptr_RefCount = local_1a0->_vptr_RefCount;
        (local_228->refCounter).super___atomic_base<unsigned_long>._M_i = _Var3;
        local_180 = (string *)(local_1a0 + 1);
        local_178 = (string *)(local_228 + 1);
        uVar6 = *(undefined7 *)&local_180->field_0x1;
        sVar4 = ((string *)(local_1a0 + 1))->_M_string_length;
        local_178->_M_dataplus = local_180->_M_dataplus;
        *(undefined7 *)&local_178->field_0x1 = uVar6;
        ((string *)(local_228 + 1))->_M_string_length = sVar4;
        local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                     *)(local_1a0 + 2);
        local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                     *)(local_228 + 2);
        uVar5 = *(undefined8 *)((long)(local_1a0 + 2) + 8);
        local_188->_M_allocated_capacity = local_190->_M_allocated_capacity;
        *(undefined8 *)((long)(local_228 + 2) + 8) = uVar5;
        uVar6 = *(undefined7 *)((long)&local_1a0[3]._vptr_RefCount + 1);
        sVar4 = ((string *)(local_1a0 + 3))->_M_string_length;
        *(_Alloc_hider *)&local_228[3]._vptr_RefCount =
             *(_Alloc_hider *)&local_1a0[3]._vptr_RefCount;
        *(undefined7 *)((long)&local_228[3]._vptr_RefCount + 1) = uVar6;
        ((string *)(local_228 + 3))->_M_string_length = sVar4;
        local_210 = local_228;
        local_198 = local_228;
        local_170 = local_1a0;
        local_168 = local_228;
      }
      local_350 = local_718[0xf].ptr;
      while (local_350 == (Node *)0x0) {
        local_100 = local_718[0x11].ptr;
        local_e8 = &local_100->fileName;
        local_f0 = &(local_100->fileName).field_2;
        local_d8 = &local_100->name;
        local_f8 = local_100;
        local_e0 = local_100;
        local_350 = (Node *)0x1;
      }
      local_68 = local_718[0x10].ptr;
      local_60 = pNVar1;
      local_58 = pRVar10;
      alignedFree(in_stack_fffffffffffff578);
      local_718[0xf].ptr = (Node *)0x1;
      local_718[0x10].ptr = pNVar8;
    }
    local_6a0 = pRVar18[0x13].ptr;
    if (local_6a0 != (Node *)0x0) {
      (*(local_6a0->super_RefCount)._vptr_RefCount[2])();
    }
    convert_mblur_to_nonmblur(pRVar18);
    if (local_6a0 != (Node *)0x0) {
      (*(local_6a0->super_RefCount)._vptr_RefCount[3])();
    }
  }
  if (pRVar18 != (Ref<embree::SceneGraph::Node> *)0x0) {
    (*(code *)(pRVar18->ptr->fileName)._M_string_length)();
  }
  return;
}

Assistant:

void SceneGraph::convert_mblur_to_nonmblur(Ref<Node> node)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->spaces.spaces.resize(1);
      convert_mblur_to_nonmblur(xfmNode->child);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      for (size_t i = 0; i < xfmNode->spaces.size(); ++i)
        xfmNode->spaces[i].spaces.resize(1);
      convert_mblur_to_nonmblur(xfmNode->child);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        convert_mblur_to_nonmblur(groupNode->children[i]);
    }
    else if (Ref<SceneGraph::TriangleMeshNode> mesh = node.dynamicCast<SceneGraph::TriangleMeshNode>()) {
      if (mesh->positions.size()) mesh->positions.resize(1);
      if (mesh->normals.size())   mesh->normals.resize(1);
    }
    else if (Ref<SceneGraph::QuadMeshNode> mesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) {
      if (mesh->positions.size()) mesh->positions.resize(1);
      if (mesh->normals.size())   mesh->normals.resize(1);
    }
    else if (Ref<SceneGraph::HairSetNode> mesh = node.dynamicCast<SceneGraph::HairSetNode>()) {
      if (mesh->positions.size()) mesh->positions.resize(1);
      if (mesh->normals.size())   mesh->normals.resize(1);
      if (mesh->tangents.size())  mesh->tangents.resize(1);
      if (mesh->dnormals.size())  mesh->dnormals.resize(1);
    }
    else if (Ref<SceneGraph::PointSetNode> mesh = node.dynamicCast<SceneGraph::PointSetNode>()) {
      if (mesh->positions.size()) mesh->positions.resize(1);
      if (mesh->normals.size())   mesh->normals.resize(1);
    }
    else if (Ref<SceneGraph::SubdivMeshNode> mesh = node.dynamicCast<SceneGraph::SubdivMeshNode>()) {
      if (mesh->positions.size()) mesh->positions.resize(1);
      if (mesh->normals .size()) mesh->normals .resize(1);
    }
    else if (Ref<SceneGraph::GridMeshNode> mesh = node.dynamicCast<SceneGraph::GridMeshNode>()) {
      mesh->positions.resize(1);
    }
  }